

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

void __thiscall tetgenmesh::meshsurface(tetgenmesh *this)

{
  uint *puVar1;
  uint uVar2;
  int iVar3;
  facet *pfVar4;
  int *piVar5;
  point pdVar6;
  arraypool *paVar7;
  int iVar8;
  arraypool *paVar9;
  long lVar10;
  tetgenbehavior *ptVar11;
  polygon *ppVar12;
  long lVar13;
  ulong uVar14;
  point pdVar15;
  long lVar16;
  long lVar17;
  point *idx2verlist_00;
  uint uVar18;
  long *local_70;
  arraypool *local_68;
  arraypool *local_60;
  point *local_58;
  long *local_50;
  ulong local_48;
  point *cons;
  point *idx2verlist;
  
  if (this->b->quiet == 0) {
    puts("Creating surface mesh ...");
  }
  makeindex2pointmap(this,&idx2verlist);
  paVar9 = (arraypool *)operator_new(0x30);
  paVar9->objectbytes = 8;
  paVar9->objectsperblock = 0x100;
  paVar9->log2objectsperblock = 8;
  paVar9->objectsperblockmark = 0xff;
  paVar9->toparraylen = 0;
  paVar9->toparray = (char **)0x0;
  paVar9->objects = 0;
  paVar9->totalmemory = 0;
  local_60 = (arraypool *)operator_new(0x30);
  local_60->objectbytes = 0x10;
  local_60->objectsperblock = 0x100;
  local_60->log2objectsperblock = 8;
  local_60->objectsperblockmark = 0xff;
  local_60->toparraylen = 0;
  local_60->toparray = (char **)0x0;
  local_60->objects = 0;
  local_60->totalmemory = 0;
  lVar17 = 1;
  local_58 = idx2verlist;
  idx2verlist_00 = idx2verlist;
  local_68 = paVar9;
  do {
    if (this->in->numberoffacets < lVar17) {
      ptVar11 = this->b;
      if (ptVar11->diagnose == 0) {
        unifysegments(this);
        if (0 < this->in->numberofedges) {
          identifyinputedges(this,idx2verlist_00);
        }
        ptVar11 = this->b;
        if (((ptVar11->psc == 0) && (ptVar11->nomergefacet == 0)) &&
           ((ptVar11->nobisect == 0 || (ptVar11->nobisect_nomerge == 0)))) {
          mergefacets(this);
          ptVar11 = this->b;
        }
      }
      if (ptVar11->object == STL) {
        jettisonnodes(this);
        ptVar11 = this->b;
      }
      if (ptVar11->verbose != 0) {
        printf("  %ld (%ld) subfaces (segments).\n",this->subfaces->items,this->subsegs->items);
      }
      this->insegments = this->subsegs->items;
      if (idx2verlist_00 != (point *)0x0) {
        operator_delete__(idx2verlist_00);
      }
      arraypool::~arraypool(paVar9);
      operator_delete(paVar9,0x30);
      paVar9 = local_60;
      arraypool::~arraypool(local_60);
      operator_delete(paVar9,0x30);
      return;
    }
    pfVar4 = this->in->facetlist;
    if (0 < this->dupverts) {
      for (lVar10 = 0; lVar10 < pfVar4[lVar17 + -1].numberofpolygons; lVar10 = lVar10 + 1) {
        ppVar12 = pfVar4[lVar17 + -1].polygonlist + lVar10;
        for (lVar13 = 0; lVar13 < ppVar12->numberofvertices; lVar13 = lVar13 + 1) {
          piVar5 = ppVar12->vertexlist;
          if ((*(uint *)((long)idx2verlist_00[piVar5[lVar13]] + (long)this->pointmarkindex * 4 + 4)
              & 0xffffff00) == 0x100) {
            piVar5[lVar13] =
                 *(int *)((long)idx2verlist_00[piVar5[lVar13]][(long)this->point2simindex + 1] +
                         (long)this->pointmarkindex * 4);
          }
        }
      }
    }
    uVar14 = 0;
LAB_0012b93f:
    paVar7 = local_60;
    if ((long)uVar14 < (long)pfVar4[lVar17 + -1].numberofpolygons) {
      ppVar12 = pfVar4[lVar17 + -1].polygonlist;
      uVar18 = *ppVar12[uVar14].vertexlist;
      iVar8 = this->in->firstnumber;
      if (((int)uVar18 < iVar8) || (iVar8 + this->in->numberofpoints <= (int)uVar18)) {
        if (this->b->quiet == 0) {
          printf("Warning:  Invalid the 1st vertex %d of polygon",(ulong)uVar18);
          uVar14 = uVar14 + 1;
          printf(" %d in facet %d.\n",uVar14 & 0xffffffff,lVar17);
        }
        else {
          uVar14 = uVar14 + 1;
        }
      }
      else {
        pdVar15 = idx2verlist_00[(int)uVar18];
        uVar2 = *(uint *)((long)pdVar15 + (long)this->pointmarkindex * 4 + 4);
        if ((uVar2 & 1) == 0) {
          *(uint *)((long)pdVar15 + (long)this->pointmarkindex * 4 + 4) = uVar2 | 1;
          arraypool::newindex(paVar9,&local_70);
          local_50 = local_70;
          *local_70 = (long)pdVar15;
        }
        ppVar12 = ppVar12 + uVar14;
        uVar14 = uVar14 + 1;
        iVar8 = ppVar12->numberofvertices;
        lVar10 = 1;
        local_48 = uVar14;
        do {
          paVar9 = local_68;
          idx2verlist_00 = local_58;
          if (iVar8 < lVar10) break;
          lVar13 = 0;
          if (lVar10 < iVar8) {
            lVar13 = lVar10;
          }
          uVar2 = ppVar12->vertexlist[lVar13];
          iVar3 = this->in->firstnumber;
          if (((int)uVar2 < iVar3) || (iVar3 + this->in->numberofpoints <= (int)uVar2)) {
            if (this->b->quiet == 0) {
              printf("Warning:  Invalid vertex %d in polygon %d",(ulong)uVar2);
LAB_0012ba4c:
              printf(" in facet %d.\n",lVar17);
              uVar14 = local_48;
            }
          }
          else if (uVar18 == uVar2) {
            if ((2 < iVar8) && (this->b->quiet == 0)) {
              printf("Warning:  Polygon %d has two identical verts",uVar14 & 0xffffffff);
              goto LAB_0012ba4c;
            }
          }
          else {
            pdVar6 = local_58[(int)uVar2];
            uVar18 = *(uint *)((long)pdVar6 + (long)this->pointmarkindex * 4 + 4);
            if ((uVar18 & 1) == 0) {
              *(uint *)((long)pdVar6 + (long)this->pointmarkindex * 4 + 4) = uVar18 | 1;
              arraypool::newindex(local_68,&local_70);
              local_50 = local_70;
              *local_70 = (long)pdVar6;
            }
            arraypool::newindex(local_60,&cons);
            *cons = pdVar15;
            cons[1] = pdVar6;
            uVar14 = local_48;
            pdVar15 = pdVar6;
            uVar18 = uVar2;
          }
          iVar8 = ppVar12->numberofvertices;
          lVar10 = lVar10 + 1;
          paVar9 = local_68;
          idx2verlist_00 = local_58;
        } while (iVar8 != 2);
      }
      goto LAB_0012b93f;
    }
    lVar10 = paVar9->objects;
    if (lVar10 < 1) {
      lVar10 = 0;
    }
    for (lVar13 = 0; lVar10 != lVar13; lVar13 = lVar13 + 1) {
      lVar16 = (long)paVar9->objectbytes * (long)(int)(paVar9->objectsperblockmark & (uint)lVar13);
      local_50 = (long *)(paVar9->toparray
                          [(uint)lVar13 >> ((byte)paVar9->log2objectsperblock & 0x1f)] + lVar16);
      puVar1 = (uint *)(*(long *)(paVar9->toparray
                                  [(uint)lVar13 >> ((byte)paVar9->log2objectsperblock & 0x1f)] +
                                 lVar16) + 4 + (long)this->pointmarkindex * 4);
      *puVar1 = *puVar1 & 0xfffffffe;
    }
    local_70 = local_50;
    piVar5 = this->in->facetmarkerlist;
    iVar8 = -1;
    if (piVar5 != (int *)0x0) {
      iVar8 = piVar5[lVar17 + -1];
    }
    triangulate(this,iVar8,paVar9,local_60,pfVar4[lVar17 + -1].numberofholes,
                pfVar4[lVar17 + -1].holelist);
    paVar9->objects = 0;
    paVar7->objects = 0;
    lVar17 = lVar17 + 1;
  } while( true );
}

Assistant:

void tetgenmesh::meshsurface()
{
  arraypool *ptlist, *conlist;
  point *idx2verlist;
  point tstart, tend, *pnewpt, *cons;
  tetgenio::facet *f;
  tetgenio::polygon *p;
  int end1, end2;
  int shmark, i, j;

  if (!b->quiet) {
    printf("Creating surface mesh ...\n");
  }

  // Create a map from indices to points.
  makeindex2pointmap(idx2verlist);

  // Initialize arrays (block size: 2^8 = 256).
  ptlist = new arraypool(sizeof(point *), 8);
  conlist = new arraypool(2 * sizeof(point *), 8);

  // Loop the facet list, triangulate each facet.
  for (shmark = 1; shmark <= in->numberoffacets; shmark++) {

    // Get a facet F.
    f = &in->facetlist[shmark - 1];

    // Process the duplicated points first, they are marked with type
    //   DUPLICATEDVERTEX.  If p and q are duplicated, and p'index > q's,
    //   then p is substituted by q.
    if (dupverts > 0l) {
      // Loop all polygons of this facet.
      for (i = 0; i < f->numberofpolygons; i++) {
        p = &(f->polygonlist[i]);
        // Loop other vertices of this polygon.
        for (j = 0; j < p->numberofvertices; j++) {
          end1 = p->vertexlist[j];
          tstart = idx2verlist[end1];
          if (pointtype(tstart) == DUPLICATEDVERTEX) {
            // Reset the index of vertex-j.
            tend = point2ppt(tstart);
            end2 = pointmark(tend);
            p->vertexlist[j] = end2;
          }
        }
      }
    }

    // Loop polygons of F, get the set of vertices and segments.
    for (i = 0; i < f->numberofpolygons; i++) {
      // Get a polygon.
      p = &(f->polygonlist[i]);
      // Get the first vertex.
      end1 = p->vertexlist[0];
      if ((end1 < in->firstnumber) || 
          (end1 >= in->firstnumber + in->numberofpoints)) {
        if (!b->quiet) {
          printf("Warning:  Invalid the 1st vertex %d of polygon", end1);
          printf(" %d in facet %d.\n", i + 1, shmark);
        }
        continue; // Skip this polygon.
      }
      tstart = idx2verlist[end1];
      // Add tstart to V if it haven't been added yet.
      if (!pinfected(tstart)) {
        pinfect(tstart);
        ptlist->newindex((void **) &pnewpt);
        *pnewpt = tstart;
      }
      // Loop other vertices of this polygon.
      for (j = 1; j <= p->numberofvertices; j++) {
        // get a vertex.
        if (j < p->numberofvertices) {
          end2 = p->vertexlist[j];
        } else {
          end2 = p->vertexlist[0];  // Form a loop from last to first.
        }
        if ((end2 < in->firstnumber) ||
            (end2 >= in->firstnumber + in->numberofpoints)) {
          if (!b->quiet) {
            printf("Warning:  Invalid vertex %d in polygon %d", end2, i + 1);
            printf(" in facet %d.\n", shmark);
          }
        } else {
          if (end1 != end2) {
            // 'end1' and 'end2' form a segment.
            tend = idx2verlist[end2];
            // Add tstart to V if it haven't been added yet.
            if (!pinfected(tend)) {
              pinfect(tend);
              ptlist->newindex((void **) &pnewpt);
              *pnewpt = tend;
            }
            // Save the segment in S (conlist).
            conlist->newindex((void **) &cons);
            cons[0] = tstart;
            cons[1] = tend;
            // Set the start for next continuous segment.
            end1 = end2;
            tstart = tend;
          } else {
            // Two identical vertices mean an isolated vertex of F.
            if (p->numberofvertices > 2) {
              // This may be an error in the input, anyway, we can continue
              //   by simply skipping this segment.
              if (!b->quiet) {
                printf("Warning:  Polygon %d has two identical verts", i + 1);
                printf(" in facet %d.\n", shmark);
              }
            } 
            // Ignore this vertex.
          }
        }
        // Is the polygon degenerate (a segment or a vertex)?
        if (p->numberofvertices == 2) break;
      }
    }
    // Unmark vertices.
    for (i = 0; i < ptlist->objects; i++) {
      pnewpt = (point *) fastlookup(ptlist, i);
      puninfect(*pnewpt);
    }

    // Triangulate F into a CDT.
    // If in->facetmarklist is NULL, use the default marker -1. 
    triangulate(in->facetmarkerlist ? in->facetmarkerlist[shmark - 1] : -1,
                ptlist, conlist, f->numberofholes, f->holelist);

    // Clear working lists.
    ptlist->restart();
    conlist->restart();
  }

  if (!b->diagnose) {
    // Remove redundant segments and build the face links.
    unifysegments();
    if (in->numberofedges > 0) { 
      // There are input segments. Insert them.
      identifyinputedges(idx2verlist);
    }
    if (!b->psc && !b->nomergefacet && 
        (!b->nobisect || (b->nobisect && !b->nobisect_nomerge))) {
      // Merge coplanar facets.
      mergefacets();
    }
  }

  if (b->object == tetgenbehavior::STL) {
    // Remove redundant vertices (for .stl input mesh).
    jettisonnodes();
  }

  if (b->verbose) {
    printf("  %ld (%ld) subfaces (segments).\n", subfaces->items, 
           subsegs->items);
  }

  // The total number of iunput segments.
  insegments = subsegs->items;

  delete [] idx2verlist;
  delete ptlist;
  delete conlist;
}